

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,704ul,16ul>>
::
nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
          (locator *__return_storage_ptr__,void *this,arrays_type *arrays_,size_t pos0,size_t hash,
          try_emplace_args_t *args,basic_string_view<char,_std::char_traits<char>_> *args_1,
          PortInfo *args_2)

{
  group15<boost::unordered::detail::foa::plain_integral> *pgVar1;
  char *pcVar2;
  uint uVar3;
  ushort uVar4;
  undefined8 uVar5;
  long lVar6;
  group15<boost::unordered::detail::foa::plain_integral> *pgVar7;
  try_emplace_args_t *ptVar8;
  undefined8 *puVar9;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
  *ppVar10;
  long lVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  
  pgVar7 = __return_storage_ptr__->pg;
  uVar12 = (ulong)__return_storage_ptr__->n;
  ppVar10 = __return_storage_ptr__->p;
  lVar11 = 1;
  while( true ) {
    pgVar1 = (group15<boost::unordered::detail::foa::plain_integral> *)
             (*(long *)((long)this + 0x10) + (long)arrays_ * 0x10);
    pcVar2 = (char *)(*(long *)((long)this + 0x10) + (long)arrays_ * 0x10);
    auVar13[0] = -(*pcVar2 == '\0');
    auVar13[1] = -(pcVar2[1] == '\0');
    auVar13[2] = -(pcVar2[2] == '\0');
    auVar13[3] = -(pcVar2[3] == '\0');
    auVar13[4] = -(pcVar2[4] == '\0');
    auVar13[5] = -(pcVar2[5] == '\0');
    auVar13[6] = -(pcVar2[6] == '\0');
    auVar13[7] = -(pcVar2[7] == '\0');
    auVar13[8] = -(pcVar2[8] == '\0');
    auVar13[9] = -(pcVar2[9] == '\0');
    auVar13[10] = -(pcVar2[10] == '\0');
    auVar13[0xb] = -(pcVar2[0xb] == '\0');
    auVar13[0xc] = -(pcVar2[0xc] == '\0');
    auVar13[0xd] = -(pcVar2[0xd] == '\0');
    auVar13[0xe] = -(pcVar2[0xe] == '\0');
    auVar13[0xf] = -(pcVar2[0xf] == '\0');
    uVar4 = (ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe;
    if (uVar4 == 0) {
      pgVar1->m[0xf].n = pgVar1->m[0xf].n | '\x01' << ((byte)pos0 & 7);
    }
    else {
      lVar6 = (long)arrays_ * 0x528 + *(long *)((long)this + 0x18);
      uVar3 = 0;
      if (uVar4 != 0) {
        for (; (uVar4 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      uVar12 = (ulong)uVar3;
      ppVar10 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                 *)(lVar6 + uVar12 * 0x58);
      uVar5 = *(undefined8 *)(hash + 8);
      puVar9 = (undefined8 *)(uVar12 * 0x58 + lVar6);
      *puVar9 = *(undefined8 *)hash;
      puVar9[1] = uVar5;
      ptVar8 = args;
      puVar9 = puVar9 + 2;
      for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar9 = *(undefined8 *)ptVar8;
        ptVar8 = ptVar8 + 8;
        puVar9 = puVar9 + 1;
      }
      pgVar1->m[uVar12].n =
           *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::
                       match_word(unsigned_long)::word + (pos0 & 0xff));
      pgVar7 = pgVar1;
    }
    if (uVar4 != 0) break;
    arrays_ = (arrays_type *)
              ((long)&arrays_->groups_size_index + lVar11 & *(ulong *)((long)this + 8));
    lVar11 = lVar11 + 1;
  }
  __return_storage_ptr__->n = (uint)uVar12;
  __return_storage_ptr__->p = ppVar10;
  __return_storage_ptr__->pg = pgVar7;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }